

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<std::array<float,_2UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::array<float,2ul>>
          (optional<std::array<float,_2UL>_> *__return_storage_ptr__,PrimVar *this)

{
  optional<std::array<float,_2UL>_> local_24;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<std::array<float,2ul>>(&local_24,this);
  nonstd::optional_lite::optional<std::array<float,_2UL>_>::optional<std::array<float,_2UL>,_0>
            (__return_storage_ptr__,&local_24);
  nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional(&local_24);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }